

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_pbf_writer.hpp
# Opt level: O2

void __thiscall
protozero::basic_pbf_writer<std::__cxx11::string>::
add_packed_sfixed32<std::istream_iterator<int,char,std::char_traits<char>,long>>
          (basic_pbf_writer<std::__cxx11::string> *this,pbf_tag_type tag,
          istream_iterator<int,_char,_std::char_traits<char>,_long> *first,
          istream_iterator<int,_char,_std::char_traits<char>,_long> *last)

{
  istream_type *local_20;
  int local_18;
  undefined1 local_14;
  istream_type *local_10;
  int local_8;
  undefined1 local_4;
  
  local_10 = first->_M_stream;
  local_8 = first->_M_value;
  local_4 = first->_M_ok;
  local_20 = last->_M_stream;
  local_18 = last->_M_value;
  local_14 = last->_M_ok;
  add_packed_fixed<int,std::istream_iterator<int,char,std::char_traits<char>,long>>
            (this,tag,&local_10,&local_20);
  return;
}

Assistant:

void add_packed_sfixed32(pbf_tag_type tag, InputIterator first, InputIterator last) { // NOLINT(performance-unnecessary-value-param)
        add_packed_fixed<int32_t, InputIterator>(tag, first, last,
            typename std::iterator_traits<InputIterator>::iterator_category{});
    }